

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covar.hpp
# Opt level: O0

void duckdb::CovarOperation::Combine<duckdb::CovarState,duckdb::RegrInterceptOperation>
               (CovarState *source,CovarState *target,AggregateInputData *param_3)

{
  uint64_t uVar1;
  double dVar2;
  double dVar3;
  uint64_t uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double deltay;
  double deltax;
  double meany;
  double meanx;
  double total_count;
  double source_count;
  double target_count;
  uint64_t count;
  AggregateInputData *param_2_local;
  CovarState *target_local;
  CovarState *source_local;
  
  if (target->count == 0) {
    target->count = source->count;
    target->meanx = source->meanx;
    target->meany = source->meany;
    target->co_moment = source->co_moment;
  }
  else if (source->count != 0) {
    uVar4 = target->count + source->count;
    uVar1 = target->count;
    auVar8._8_4_ = (int)(uVar1 >> 0x20);
    auVar8._0_8_ = uVar1;
    auVar8._12_4_ = 0x45300000;
    dVar5 = (auVar8._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
    uVar1 = source->count;
    auVar9._8_4_ = (int)(uVar1 >> 0x20);
    auVar9._0_8_ = uVar1;
    auVar9._12_4_ = 0x45300000;
    dVar6 = (auVar9._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
    auVar10._8_4_ = (int)(uVar4 >> 0x20);
    auVar10._0_8_ = uVar4;
    auVar10._12_4_ = 0x45300000;
    dVar7 = (auVar10._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0);
    dVar2 = source->meanx;
    dVar3 = source->meany;
    target->co_moment =
         source->co_moment + target->co_moment +
         ((target->meanx - source->meanx) * (target->meany - source->meany) * dVar6 * dVar5) / dVar7
    ;
    target->meanx = (dVar6 * dVar2 + dVar5 * target->meanx) / dVar7;
    target->meany = (dVar6 * dVar3 + dVar5 * target->meany) / dVar7;
    target->count = uVar4;
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (target.count == 0) {
			target = source;
		} else if (source.count > 0) {
			const auto count = target.count + source.count;
			D_ASSERT(count >= target.count); // This is a check that we are not overflowing
			const auto target_count = static_cast<double>(target.count);
			const auto source_count = static_cast<double>(source.count);
			const auto total_count = static_cast<double>(count);
			const auto meanx = (source_count * source.meanx + target_count * target.meanx) / total_count;
			const auto meany = (source_count * source.meany + target_count * target.meany) / total_count;

			//  Schubert and Gertz SSDBM 2018, equation 21
			const auto deltax = target.meanx - source.meanx;
			const auto deltay = target.meany - source.meany;
			target.co_moment =
			    source.co_moment + target.co_moment + deltax * deltay * source_count * target_count / total_count;
			target.meanx = meanx;
			target.meany = meany;
			target.count = count;
		}
	}